

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCFGReader.cpp
# Opt level: O2

Addr str2addr(string *str)

{
  int iVar1;
  unsigned_long uVar2;
  string local_30;
  
  iVar1 = std::__cxx11::string::compare((ulong)str,0,(char *)0x2);
  if (iVar1 != 0) {
    __assert_fail("str.compare(0, 2, \"0x\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                  ,0xb4,"Addr str2addr(const std::string &)");
  }
  std::__cxx11::string::substr((ulong)&local_30,(ulong)str);
  uVar2 = std::__cxx11::stoul(&local_30,(size_t *)0x0,0x10);
  std::__cxx11::string::~string((string *)&local_30);
  if (uVar2 != 0) {
    return uVar2;
  }
  __assert_fail("addr != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                ,0xb6,"Addr str2addr(const std::string &)");
}

Assistant:

static
Addr str2addr(const std::string& str) {
	assert(str.compare(0, 2, "0x") == 0);
	Addr addr = std::stoul(str.substr(2), 0, 16);
	assert(addr != 0);

	return addr;
}